

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O3

void __thiscall google::protobuf::DynamicMessage::~DynamicMessage(DynamicMessage *this)

{
  FieldDescriptor *this_00;
  byte bVar1;
  Descriptor *pDVar2;
  FieldDescriptor *pFVar3;
  long lVar4;
  Cord *this_01;
  DynamicMessage *pDVar5;
  long *plVar6;
  CppStringType CVar7;
  TypeInfo *pTVar8;
  Nonnull<const_char_*> failure_msg;
  int iVar9;
  bool bVar10;
  long lVar11;
  long lVar12;
  DynamicMapField *this_02;
  LogMessageFatal local_40;
  
  pTVar8 = this->type_info_;
  pDVar2 = (pTVar8->class_data).descriptor;
  if (((this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) != 0) {
    internal::InternalMetadata::DeleteOutOfLineHelper<google::protobuf::UnknownFieldSet>
              (&(this->super_Message).super_MessageLite._internal_metadata_);
    pTVar8 = this->type_info_;
  }
  if ((long)pTVar8->extensions_offset != -1) {
    internal::ExtensionSet::~ExtensionSet
              ((ExtensionSet *)
               ((long)&(this->super_Message).super_MessageLite._vptr_MessageLite +
               (long)pTVar8->extensions_offset));
  }
  if (0 < pDVar2->field_count_) {
    lVar12 = 0;
    lVar11 = 0;
    do {
      pFVar3 = pDVar2->fields_;
      this_00 = (FieldDescriptor *)(&pFVar3->super_SymbolBase + lVar12);
      if (((&pFVar3->field_0x3)[lVar12] & 1) == 0) {
        bVar1 = (&pFVar3->field_0x1)[lVar12];
        bVar10 = (bool)((bVar1 & 0x20) >> 5);
        if (0xbf < bVar1 != bVar10) {
          failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                  (bVar10,0xbf < bVar1,
                                   "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    (&local_40,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xb54,failure_msg);
LAB_001cd29f:
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_40);
        }
        this_02 = (DynamicMapField *)
                  ((long)&(this->super_Message).super_MessageLite._vptr_MessageLite +
                  (long)(int)(this->type_info_->offsets)._M_t.
                             super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                             .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl[lVar11]);
        iVar9 = *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(&pFVar3->type_)[lVar12] * 4);
        if ((bVar1 & 0x20) == 0) {
          if (iVar9 == 10) {
            pDVar5 = (DynamicMessage *)(this->type_info_->class_data).super_ClassData.prototype;
            if (pDVar5 != (DynamicMessage *)0x0 && pDVar5 != this) {
LAB_001cd185:
              plVar6 = (long *)(this_02->super_MapFieldBase).super_MapFieldBaseForParse.payload_.
                               _M_i;
              if (plVar6 != (long *)0x0) {
                (**(code **)(*plVar6 + 8))();
              }
            }
          }
          else if (iVar9 == 9) {
            CVar7 = FieldDescriptor::cpp_string_type(this_00);
            if ((CVar7 == kView) || (CVar7 == kString)) {
LAB_001cd19c:
              internal::ArenaStringPtr::Destroy((ArenaStringPtr *)this_02);
            }
            else if (CVar7 == kCord) {
              absl::lts_20250127::Cord::~Cord((Cord *)this_02);
            }
          }
        }
        else {
          switch(iVar9) {
          case 1:
          case 8:
            RepeatedField<int>::~RepeatedField((RepeatedField<int> *)this_02);
            break;
          case 2:
            RepeatedField<long>::~RepeatedField((RepeatedField<long> *)this_02);
            break;
          case 3:
            RepeatedField<unsigned_int>::~RepeatedField((RepeatedField<unsigned_int> *)this_02);
            break;
          case 4:
            RepeatedField<unsigned_long>::~RepeatedField((RepeatedField<unsigned_long> *)this_02);
            break;
          case 5:
            RepeatedField<double>::~RepeatedField((RepeatedField<double> *)this_02);
            break;
          case 6:
            RepeatedField<float>::~RepeatedField((RepeatedField<float> *)this_02);
            break;
          case 7:
            RepeatedField<bool>::~RepeatedField((RepeatedField<bool> *)this_02);
            break;
          case 9:
            CVar7 = FieldDescriptor::cpp_string_type(this_00);
            if ((CVar7 == kView) || (CVar7 == kString)) {
              RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~RepeatedPtrField((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                   *)this_02);
            }
            else if (CVar7 == kCord) {
              RepeatedField<absl::lts_20250127::Cord>::~RepeatedField
                        ((RepeatedField<absl::lts_20250127::Cord> *)this_02);
            }
            break;
          case 10:
            if (((&pFVar3->type_)[lVar12] == 0xb) &&
               (bVar10 = FieldDescriptor::is_map_message_type(this_00), bVar10)) {
              internal::DynamicMapField::~DynamicMapField(this_02);
            }
            else {
              RepeatedPtrField<google::protobuf::Message>::~RepeatedPtrField
                        ((RepeatedPtrField<google::protobuf::Message> *)this_02);
            }
          }
        }
      }
      else {
        if (((&pFVar3->field_0x1)[lVar12] & 0x10) == 0) {
          iVar9 = 0xb63;
LAB_001cd2b5:
          internal::protobuf_assumption_failed
                    ("res != nullptr",
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,iVar9);
        }
        lVar4 = *(long *)((long)&pFVar3->scope_ + lVar12);
        if (lVar4 == 0) {
          iVar9 = 0xb31;
          goto LAB_001cd2b5;
        }
        if ((*(int *)(lVar4 + 4) == 1) && ((*(byte *)(*(long *)(lVar4 + 0x30) + 1) & 2) != 0)) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    (&local_40,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                     ,0xb64,"!res->is_synthetic()");
          goto LAB_001cd29f;
        }
        iVar9 = (int)((ulong)(lVar4 - *(long *)(*(long *)(lVar4 + 0x10) + 0x48)) >> 3);
        pTVar8 = this->type_info_;
        if (*(int *)((long)&(this->super_Message).super_MessageLite._vptr_MessageLite +
                    (long)(iVar9 * -0x24924924 + pTVar8->oneof_case_offset)) ==
            *(int *)((long)&pFVar3->number_ + lVar12)) {
          this_02 = (DynamicMapField *)
                    ((long)&(this->super_Message).super_MessageLite._vptr_MessageLite +
                    (long)(int)(pTVar8->offsets)._M_t.
                               super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                               .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl
                               [(long)(iVar9 * -0x49249249) +
                                (long)((pTVar8->class_data).descriptor)->field_count_]);
          if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(&pFVar3->type_)[lVar12] * 4) ==
              10) goto LAB_001cd185;
          if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(&pFVar3->type_)[lVar12] * 4) ==
              9) {
            CVar7 = FieldDescriptor::cpp_string_type(this_00);
            if ((CVar7 == kView) || (CVar7 == kString)) goto LAB_001cd19c;
            if (CVar7 == kCord) {
              this_01 = (Cord *)(this_02->super_MapFieldBase).super_MapFieldBaseForParse.payload_.
                                _M_i;
              if (this_01 != (Cord *)0x0) {
                absl::lts_20250127::Cord::~Cord(this_01);
              }
              operator_delete(this_01,0x10);
            }
          }
        }
      }
      lVar11 = lVar11 + 1;
      lVar12 = lVar12 + 0x58;
    } while (lVar11 < pDVar2->field_count_);
  }
  return;
}

Assistant:

DynamicMessage::~DynamicMessage() {
  const Descriptor* descriptor = type_info_->class_data.descriptor;

  _internal_metadata_.Delete<UnknownFieldSet>();

  if (type_info_->extensions_offset != -1) {
    reinterpret_cast<ExtensionSet*>(MutableExtensionsRaw())->~ExtensionSet();
  }

  // We need to manually run the destructors for repeated fields and strings,
  // just as we ran their constructors in the DynamicMessage constructor.
  // We also need to manually delete oneof fields if it is set and is string
  // or message.
  // Additionally, if any singular embedded messages have been allocated, we
  // need to delete them, UNLESS we are the prototype message of this type,
  // in which case any embedded messages are other prototypes and shouldn't
  // be touched.
  for (int i = 0; i < descriptor->field_count(); i++) {
    const FieldDescriptor* field = descriptor->field(i);
    if (InRealOneof(field)) {
      void* field_ptr = MutableOneofCaseRaw(field->containing_oneof()->index());
      if (*(reinterpret_cast<const int32_t*>(field_ptr)) == field->number()) {
        field_ptr = MutableOneofFieldRaw(field);
        if (field->cpp_type() == FieldDescriptor::CPPTYPE_STRING) {
          switch (field->cpp_string_type()) {
            case FieldDescriptor::CppStringType::kCord:
              delete *reinterpret_cast<absl::Cord**>(field_ptr);
              break;
            case FieldDescriptor::CppStringType::kView:
              if (internal::EnableExperimentalMicroString()) {
                reinterpret_cast<MicroString*>(field_ptr)->Destroy();
                break;
              }
              [[fallthrough]];
            case FieldDescriptor::CppStringType::kString: {
              reinterpret_cast<ArenaStringPtr*>(field_ptr)->Destroy();
              break;
            }
          }
        } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
            delete *reinterpret_cast<Message**>(field_ptr);
        }
      }
      continue;
    }
    void* field_ptr = MutableRaw(i);

    if (field->is_repeated()) {
      switch (field->cpp_type()) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                  \
  case FieldDescriptor::CPPTYPE_##UPPERCASE:               \
    reinterpret_cast<RepeatedField<LOWERCASE>*>(field_ptr) \
        ->~RepeatedField<LOWERCASE>();                     \
    break

        HANDLE_TYPE(INT32, int32_t);
        HANDLE_TYPE(INT64, int64_t);
        HANDLE_TYPE(UINT32, uint32_t);
        HANDLE_TYPE(UINT64, uint64_t);
        HANDLE_TYPE(DOUBLE, double);
        HANDLE_TYPE(FLOAT, float);
        HANDLE_TYPE(BOOL, bool);
        HANDLE_TYPE(ENUM, int);
#undef HANDLE_TYPE

        case FieldDescriptor::CPPTYPE_STRING:
          switch (field->cpp_string_type()) {
            case FieldDescriptor::CppStringType::kCord:
              reinterpret_cast<RepeatedField<absl::Cord>*>(field_ptr)
                  ->~RepeatedField<absl::Cord>();
              break;
            case FieldDescriptor::CppStringType::kView:
            case FieldDescriptor::CppStringType::kString:
              reinterpret_cast<RepeatedPtrField<std::string>*>(field_ptr)
                  ->~RepeatedPtrField<std::string>();
              break;
          }
          break;

        case FieldDescriptor::CPPTYPE_MESSAGE:
          if (IsMapFieldInApi(field)) {
            reinterpret_cast<DynamicMapField*>(field_ptr)->~DynamicMapField();
          } else {
            reinterpret_cast<RepeatedPtrField<Message>*>(field_ptr)
                ->~RepeatedPtrField<Message>();
          }
          break;
      }

    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_STRING) {
      switch (field->cpp_string_type()) {
        case FieldDescriptor::CppStringType::kCord:
          reinterpret_cast<absl::Cord*>(field_ptr)->~Cord();
          break;
        case FieldDescriptor::CppStringType::kView:
          if (internal::EnableExperimentalMicroString()) {
            MutableRaw<MicroString>(i)->Destroy();
            break;
          }
          [[fallthrough]];
        case FieldDescriptor::CppStringType::kString: {
          reinterpret_cast<ArenaStringPtr*>(field_ptr)->Destroy();
          break;
        }
      }
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
          if (!is_prototype()) {
        Message* message = *reinterpret_cast<Message**>(field_ptr);
        if (message != nullptr) {
          delete message;
        }
      }
    }
  }
}